

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ARMInstPrinter.c
# Opt level: O2

void printBitfieldInvMaskImmOperand(MCInst *MI,uint OpNum,SStream *O)

{
  uint8_t *puVar1;
  cs_detail *pcVar2;
  uint uVar3;
  MCOperand *op;
  int64_t iVar4;
  char *pcVar5;
  uint uVar6;
  uint uVar7;
  
  op = MCInst_getOperand(MI,OpNum);
  iVar4 = MCOperand_getImm(op);
  uVar3 = (uint)iVar4 ^ 0xffffffff;
  uVar6 = 0x20;
  uVar7 = uVar6;
  if ((uVar3 != 0) && (uVar7 = 0, uVar3 != 0)) {
    for (; (uVar3 >> uVar7 & 1) == 0; uVar7 = uVar7 + 1) {
    }
  }
  if (uVar3 != 0) {
    uVar6 = 0x1f;
    if (uVar3 != 0) {
      for (; uVar3 >> uVar6 == 0; uVar6 = uVar6 - 1) {
      }
    }
    uVar6 = uVar6 ^ 0x1f;
  }
  uVar3 = 0x20 - (uVar6 + uVar7);
  pcVar5 = ", #%u";
  if (9 < uVar7) {
    pcVar5 = ", #0x%x";
  }
  SStream_concat(O,pcVar5 + 2,(ulong)uVar7);
  pcVar5 = ", #%u";
  if (uVar6 + uVar7 < 0x17) {
    pcVar5 = ", #0x%x";
  }
  SStream_concat(O,pcVar5,(ulong)uVar3);
  if (MI->csh->detail != CS_OPT_OFF) {
    pcVar2 = MI->flat_insn->detail;
    puVar1 = pcVar2->groups + (ulong)(pcVar2->field_6).arm.op_count * 0x28 + 0x42;
    puVar1[0] = '\x02';
    puVar1[1] = '\0';
    puVar1[2] = '\0';
    puVar1[3] = '\0';
    pcVar2 = MI->flat_insn->detail;
    *(uint *)(pcVar2->groups + (ulong)(pcVar2->field_6).arm.op_count * 0x28 + 0x46) = uVar7;
    puVar1 = &(MI->flat_insn->detail->field_6).arm.op_count;
    *puVar1 = *puVar1 + '\x01';
    pcVar2 = MI->flat_insn->detail;
    puVar1 = pcVar2->groups + (ulong)(pcVar2->field_6).arm.op_count * 0x28 + 0x42;
    puVar1[0] = '\x02';
    puVar1[1] = '\0';
    puVar1[2] = '\0';
    puVar1[3] = '\0';
    pcVar2 = MI->flat_insn->detail;
    *(uint *)(pcVar2->groups + (ulong)(pcVar2->field_6).arm.op_count * 0x28 + 0x46) = uVar3;
    puVar1 = &(MI->flat_insn->detail->field_6).arm.op_count;
    *puVar1 = *puVar1 + '\x01';
  }
  return;
}

Assistant:

static void printBitfieldInvMaskImmOperand(MCInst *MI, unsigned OpNum, SStream *O)
{
	MCOperand *MO = MCInst_getOperand(MI, OpNum);
	uint32_t v = ~(uint32_t)MCOperand_getImm(MO);
	int32_t lsb = CountTrailingZeros_32(v);
	int32_t width = (32 - CountLeadingZeros_32 (v)) - lsb;

	//assert(MO.isImm() && "Not a valid bf_inv_mask_imm value!");
	if (lsb > HEX_THRESHOLD)
		SStream_concat(O, "#0x%x", lsb);
	else
		SStream_concat(O, "#%u", lsb);

	if (width > HEX_THRESHOLD)
		SStream_concat(O, ", #0x%x", width);
	else
		SStream_concat(O, ", #%u", width);

	if (MI->csh->detail) {
		MI->flat_insn->detail->arm.operands[MI->flat_insn->detail->arm.op_count].type = ARM_OP_IMM;
		MI->flat_insn->detail->arm.operands[MI->flat_insn->detail->arm.op_count].imm = lsb;
		MI->flat_insn->detail->arm.op_count++;
		MI->flat_insn->detail->arm.operands[MI->flat_insn->detail->arm.op_count].type = ARM_OP_IMM;
		MI->flat_insn->detail->arm.operands[MI->flat_insn->detail->arm.op_count].imm = width;
		MI->flat_insn->detail->arm.op_count++;
	}
}